

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  pointer pRVar2;
  size_t size;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  byte *pbVar7;
  bool bVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (this->len != 0) {
    size = this->len * 0x48;
    pbVar3 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
    if (*(byte **)(dst + 8) < pbVar3 + size) {
      pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
    }
    else {
      *(byte **)(*(long *)dst + 8) = pbVar3 + size;
    }
    sVar1 = this->len;
    if (sVar1 != 0) {
      pRVar2 = this->data_;
      lVar4 = 0;
      do {
        puVar6 = (undefined8 *)((long)&(pRVar2->ruleBlock).ptr + lVar4);
        pbVar7 = pbVar3 + lVar4;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)pbVar7 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          pbVar7 = pbVar7 + (ulong)bVar9 * -0x10 + 8;
        }
        bVar8 = sVar1 * 0x48 + -0x48 != lVar4;
      } while ((bVar8) && (lVar4 = lVar4 + 0x48, bVar8));
    }
    return (int)pbVar3;
  }
  return 0;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }